

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O3

char * Acb_EnumerateSatAssigns
                 (sat_solver *pSat,int PivotVar,int FreeVar,Vec_Int_t *vDivVars,Vec_Int_t *vTempLits
                 ,Vec_Str_t *vTempSop)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  undefined8 *__ptr;
  int iVar4;
  char *pcVar5;
  undefined8 *puVar6;
  void *pvVar7;
  long lVar8;
  long lVar9;
  int i;
  sat_solver *psVar10;
  ulong uVar11;
  size_t sVar12;
  uint *puVar13;
  uint uVar14;
  int pLits [2];
  uint local_58;
  uint local_54;
  sat_solver *local_50;
  undefined8 *local_48;
  undefined8 *local_40;
  ulong local_38;
  
  local_50 = pSat;
  iVar4 = sat_solver_nvars(pSat);
  if (iVar4 <= FreeVar) {
    __assert_fail("FreeVar < sat_solver_nvars(pSat)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                  ,0x5e6,
                  "char *Acb_EnumerateSatAssigns(sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Str_t *)"
                 );
  }
  if ((PivotVar < 0) || (local_58 = PivotVar * 2 + 1, FreeVar < 0)) {
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  local_54 = FreeVar * 2;
  vTempSop->nSize = 0;
  iVar4 = vDivVars->nSize * 8 + 0x19;
  if (vTempSop->nCap < iVar4) {
    if (vTempSop->pArray == (char *)0x0) {
      pcVar5 = (char *)malloc((long)iVar4);
    }
    else {
      pcVar5 = (char *)realloc(vTempSop->pArray,(long)iVar4);
    }
    vTempSop->pArray = pcVar5;
    vTempSop->nCap = iVar4;
  }
  psVar10 = local_50;
  iVar4 = sat_solver_solve(local_50,(lit *)&local_58,(lit *)&local_50,0,0,0,0);
  if (iVar4 == -1) {
    uVar14 = vTempSop->nSize;
    if (uVar14 == vTempSop->nCap) {
      if ((int)uVar14 < 0x10) {
        if (vTempSop->pArray == (char *)0x0) {
          pcVar5 = (char *)malloc(0x10);
        }
        else {
          pcVar5 = (char *)realloc(vTempSop->pArray,0x10);
        }
        vTempSop->pArray = pcVar5;
        vTempSop->nCap = 0x10;
      }
      else {
        sVar12 = (ulong)uVar14 * 2;
        if (vTempSop->pArray == (char *)0x0) {
          pcVar5 = (char *)malloc(sVar12);
        }
        else {
          pcVar5 = (char *)realloc(vTempSop->pArray,sVar12);
        }
        vTempSop->pArray = pcVar5;
        vTempSop->nCap = (int)sVar12;
      }
    }
    else {
      pcVar5 = vTempSop->pArray;
    }
    iVar4 = vTempSop->nSize;
    vTempSop->nSize = iVar4 + 1;
LAB_0039748c:
    pcVar5[iVar4] = ' ';
    uVar14 = vTempSop->nSize;
    if (uVar14 == vTempSop->nCap) {
      if ((int)uVar14 < 0x10) {
        if (vTempSop->pArray == (char *)0x0) {
          pcVar5 = (char *)malloc(0x10);
        }
        else {
          pcVar5 = (char *)realloc(vTempSop->pArray,0x10);
        }
        vTempSop->pArray = pcVar5;
        vTempSop->nCap = 0x10;
      }
      else {
        sVar12 = (ulong)uVar14 * 2;
        if (vTempSop->pArray == (char *)0x0) {
          pcVar5 = (char *)malloc(sVar12);
        }
        else {
          pcVar5 = (char *)realloc(vTempSop->pArray,sVar12);
        }
        vTempSop->pArray = pcVar5;
        vTempSop->nCap = (int)sVar12;
      }
    }
    else {
      pcVar5 = vTempSop->pArray;
    }
    iVar4 = vTempSop->nSize;
    vTempSop->nSize = iVar4 + 1;
    pcVar5[iVar4] = '0';
  }
  else {
    if ((int)local_58 < 0) {
LAB_00397660:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x131,"int Abc_LitNot(int)");
    }
    local_58 = local_58 ^ 1;
    iVar4 = sat_solver_solve(psVar10,(lit *)&local_58,(lit *)&local_50,0,0,0,0);
    if ((int)local_58 < 0) goto LAB_00397660;
    local_58 = local_58 ^ 1;
    if ((iVar4 != -1) && (vDivVars->nSize != 0)) {
      puVar6 = (undefined8 *)malloc(0x10);
      *puVar6 = 100;
      pvVar7 = malloc(400);
      puVar6[1] = pvVar7;
      local_48 = puVar6;
      puVar6 = (undefined8 *)malloc(0x10);
      *puVar6 = 100;
      pvVar7 = malloc(400);
      puVar6[1] = pvVar7;
      uVar11 = 0;
      local_40 = puVar6;
      do {
        iVar4 = sat_solver_solve(psVar10,(lit *)&local_58,(lit *)&local_50,0,0,0,0);
        if (iVar4 != 1) {
          if (iVar4 != -1) {
            __assert_fail("status == l_True",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                          ,0x623,
                          "char *Acb_EnumerateSatAssigns(sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Str_t *)"
                         );
          }
          printf("Finished enumerating %d cubes.\n",uVar11);
          __ptr = local_40;
          puVar6 = local_48;
          if ((void *)local_48[1] != (void *)0x0) {
            free((void *)local_48[1]);
          }
          free(puVar6);
          pvVar7 = (void *)__ptr[1];
          if (pvVar7 != (void *)0x0) {
            free(pvVar7);
          }
          free(__ptr);
          goto LAB_00397576;
        }
        vTempLits->nSize = 0;
        local_38 = uVar11;
        if ((int)local_58 < 0) goto LAB_00397660;
        Vec_IntPush(vTempLits,local_58 ^ 1);
        uVar11 = (long)vDivVars->nSize;
        if (0 < (long)vDivVars->nSize) {
          do {
            if ((long)vDivVars->nSize < (long)uVar11) goto LAB_00397641;
            iVar4 = vDivVars->pArray[uVar11 - 1];
            if (((long)iVar4 < 0) || (local_50->size <= iVar4)) {
              __assert_fail("v >= 0 && v < s->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                            ,0xdf,"int sat_solver_var_literal(sat_solver *, int)");
            }
            Vec_IntPush(vTempLits,(uint)(local_50->model[iVar4] != 1) + iVar4 * 2);
            bVar3 = 1 < uVar11;
            uVar11 = uVar11 - 1;
          } while (bVar3);
          if (0 < vDivVars->nSize) {
            iVar4 = 0;
            do {
              uVar14 = vTempSop->nSize;
              if (uVar14 == vTempSop->nCap) {
                if ((int)uVar14 < 0x10) {
                  if (vTempSop->pArray == (char *)0x0) {
                    pcVar5 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar5 = (char *)realloc(vTempSop->pArray,0x10);
                  }
                  vTempSop->pArray = pcVar5;
                  vTempSop->nCap = 0x10;
                }
                else {
                  sVar12 = (ulong)uVar14 * 2;
                  if (vTempSop->pArray == (char *)0x0) {
                    pcVar5 = (char *)malloc(sVar12);
                  }
                  else {
                    pcVar5 = (char *)realloc(vTempSop->pArray,sVar12);
                  }
                  vTempSop->pArray = pcVar5;
                  vTempSop->nCap = (int)sVar12;
                }
              }
              else {
                pcVar5 = vTempSop->pArray;
              }
              iVar2 = vTempSop->nSize;
              vTempSop->nSize = iVar2 + 1;
              pcVar5[iVar2] = '-';
              iVar4 = iVar4 + 1;
            } while (iVar4 < vDivVars->nSize);
          }
        }
        psVar10 = local_50;
        if (vTempLits->nSize < 1) {
LAB_00397641:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar4 = sat_solver_push(local_50,*vTempLits->pArray);
        if (iVar4 != 1) {
          __assert_fail("status == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                        ,0x636,
                        "char *Acb_EnumerateSatAssigns(sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Str_t *)"
                       );
        }
        iVar4 = sat_solver_minimize_assumptions
                          (psVar10,vTempLits->pArray + 1,vTempLits->nSize + -1,0);
        if (vTempLits->nSize <= iVar4) {
          __assert_fail("p->nSize >= nSizeNew",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
        }
        vTempLits->nSize = iVar4 + 1;
        sat_solver_pop(psVar10);
        if ((int)local_54 < 0) goto LAB_00397660;
        if (vTempLits->nSize < 1) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        *vTempLits->pArray = local_54 ^ 1;
        if (1 < vTempLits->nSize) {
          lVar8 = 1;
          do {
            uVar14 = vTempLits->pArray[lVar8];
            if ((int)uVar14 < 0) goto LAB_00397660;
            vTempLits->pArray[lVar8] = uVar14 ^ 1;
            lVar9 = (long)vDivVars->nSize;
            if (lVar9 < 1) {
LAB_00397603:
              __assert_fail("iVar >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                            ,0x63f,
                            "char *Acb_EnumerateSatAssigns(sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Str_t *)"
                           );
            }
            puVar13 = (uint *)vDivVars->pArray;
            while (*puVar13 != uVar14 >> 1) {
              puVar13 = puVar13 + 1;
              lVar9 = lVar9 + -1;
              if (lVar9 == 0) goto LAB_00397603;
            }
            uVar11 = (ulong)(uint)vTempSop->nSize - lVar9;
            iVar4 = (int)uVar11;
            if ((iVar4 < 0) || (vTempSop->nSize <= iVar4)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                            ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
            }
            vTempSop->pArray[uVar11 & 0xffffffff] = (byte)uVar14 & 1 ^ 0x31;
            lVar8 = lVar8 + 1;
          } while (lVar8 < vTempLits->nSize);
        }
        lVar8 = 0;
        do {
          cVar1 = ".names n%0*d\n 1\n"[lVar8 + 0xd];
          uVar14 = vTempSop->nSize;
          if (uVar14 == vTempSop->nCap) {
            if ((int)uVar14 < 0x10) {
              if (vTempSop->pArray == (char *)0x0) {
                pcVar5 = (char *)malloc(0x10);
              }
              else {
                pcVar5 = (char *)realloc(vTempSop->pArray,0x10);
              }
              vTempSop->pArray = pcVar5;
              vTempSop->nCap = 0x10;
            }
            else {
              sVar12 = (ulong)uVar14 * 2;
              if (vTempSop->pArray == (char *)0x0) {
                pcVar5 = (char *)malloc(sVar12);
              }
              else {
                pcVar5 = (char *)realloc(vTempSop->pArray,sVar12);
              }
              vTempSop->pArray = pcVar5;
              vTempSop->nCap = (int)sVar12;
            }
          }
          else {
            pcVar5 = vTempSop->pArray;
          }
          psVar10 = local_50;
          iVar4 = vTempSop->nSize;
          vTempSop->nSize = iVar4 + 1;
          pcVar5[iVar4] = cVar1;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        iVar4 = sat_solver_addclause
                          (local_50,vTempLits->pArray,vTempLits->pArray + vTempLits->nSize);
        if (iVar4 == 0) {
          __assert_fail("status",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                        ,0x68f,
                        "char *Acb_EnumerateSatAssigns(sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Str_t *)"
                       );
        }
        uVar14 = (int)local_38 + 1;
        uVar11 = (ulong)uVar14;
      } while (uVar14 != 1000);
      if (vDivVars->nSize != 0) {
        puts("Reached the limit on the number of cubes (1000).");
        puVar6 = local_48;
        if ((void *)local_48[1] != (void *)0x0) {
          free((void *)local_48[1]);
        }
        free(puVar6);
        puVar6 = local_40;
        if ((void *)local_40[1] != (void *)0x0) {
          free((void *)local_40[1]);
        }
        free(puVar6);
        return (char *)0x0;
      }
      puts("Assuming constant 0 function.");
      vTempSop->nSize = 0;
      iVar4 = 0;
      pcVar5 = vTempSop->pArray;
      if (vTempSop->nCap == 0) {
        if (pcVar5 == (char *)0x0) {
          pcVar5 = (char *)malloc(0x10);
          iVar4 = 0;
        }
        else {
          pcVar5 = (char *)realloc(pcVar5,0x10);
          iVar4 = vTempSop->nSize;
        }
        vTempSop->pArray = pcVar5;
        vTempSop->nCap = 0x10;
      }
      vTempSop->nSize = iVar4 + 1;
      goto LAB_0039748c;
    }
    uVar14 = vTempSop->nSize;
    if (uVar14 == vTempSop->nCap) {
      if ((int)uVar14 < 0x10) {
        if (vTempSop->pArray == (char *)0x0) {
          pcVar5 = (char *)malloc(0x10);
        }
        else {
          pcVar5 = (char *)realloc(vTempSop->pArray,0x10);
        }
        vTempSop->pArray = pcVar5;
        vTempSop->nCap = 0x10;
      }
      else {
        sVar12 = (ulong)uVar14 * 2;
        if (vTempSop->pArray == (char *)0x0) {
          pcVar5 = (char *)malloc(sVar12);
        }
        else {
          pcVar5 = (char *)realloc(vTempSop->pArray,sVar12);
        }
        vTempSop->pArray = pcVar5;
        vTempSop->nCap = (int)sVar12;
      }
    }
    else {
      pcVar5 = vTempSop->pArray;
    }
    iVar4 = vTempSop->nSize;
    vTempSop->nSize = iVar4 + 1;
    pcVar5[iVar4] = ' ';
    uVar14 = vTempSop->nSize;
    if (uVar14 == vTempSop->nCap) {
      if ((int)uVar14 < 0x10) {
        if (vTempSop->pArray == (char *)0x0) {
          pcVar5 = (char *)malloc(0x10);
        }
        else {
          pcVar5 = (char *)realloc(vTempSop->pArray,0x10);
        }
        vTempSop->pArray = pcVar5;
        vTempSop->nCap = 0x10;
      }
      else {
        sVar12 = (ulong)uVar14 * 2;
        if (vTempSop->pArray == (char *)0x0) {
          pcVar5 = (char *)malloc(sVar12);
        }
        else {
          pcVar5 = (char *)realloc(vTempSop->pArray,sVar12);
        }
        vTempSop->pArray = pcVar5;
        vTempSop->nCap = (int)sVar12;
      }
    }
    else {
      pcVar5 = vTempSop->pArray;
    }
    iVar4 = vTempSop->nSize;
    vTempSop->nSize = iVar4 + 1;
    pcVar5[iVar4] = '1';
  }
  uVar14 = vTempSop->nSize;
  if (uVar14 == vTempSop->nCap) {
    if ((int)uVar14 < 0x10) {
      if (vTempSop->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(0x10);
      }
      else {
        pcVar5 = (char *)realloc(vTempSop->pArray,0x10);
      }
      vTempSop->pArray = pcVar5;
      vTempSop->nCap = 0x10;
    }
    else {
      sVar12 = (ulong)uVar14 * 2;
      if (vTempSop->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(sVar12);
      }
      else {
        pcVar5 = (char *)realloc(vTempSop->pArray,sVar12);
      }
      vTempSop->pArray = pcVar5;
      vTempSop->nCap = (int)sVar12;
    }
  }
  else {
    pcVar5 = vTempSop->pArray;
  }
  iVar4 = vTempSop->nSize;
  vTempSop->nSize = iVar4 + 1;
  pcVar5[iVar4] = '\n';
LAB_00397576:
  uVar14 = vTempSop->nSize;
  if (uVar14 != vTempSop->nCap) {
    pcVar5 = vTempSop->pArray;
    goto LAB_003975be;
  }
  if ((int)uVar14 < 0x10) {
    pcVar5 = vTempSop->pArray;
    if (pcVar5 != (char *)0x0) {
      sVar12 = 0x10;
      goto LAB_003975a4;
    }
    sVar12 = 0x10;
LAB_003975b5:
    pcVar5 = (char *)malloc(sVar12);
  }
  else {
    sVar12 = (ulong)uVar14 * 2;
    pcVar5 = vTempSop->pArray;
    if (pcVar5 == (char *)0x0) goto LAB_003975b5;
LAB_003975a4:
    pcVar5 = (char *)realloc(pcVar5,sVar12);
  }
  vTempSop->pArray = pcVar5;
LAB_003975be:
  pcVar5[vTempSop->nSize] = '\0';
  pcVar5 = vTempSop->pArray;
  vTempSop->nCap = 0;
  vTempSop->nSize = 0;
  vTempSop->pArray = (char *)0x0;
  return pcVar5;
}

Assistant:

char * Acb_EnumerateSatAssigns( sat_solver * pSat, int PivotVar, int FreeVar, Vec_Int_t * vDivVars, Vec_Int_t * vTempLits, Vec_Str_t * vTempSop )
{
    int fCreatePrime = 1;
    int status, i, iMint, iVar, iLit, nFinal, * pFinal, pLits[2];
    Vec_Int_t * vTemp, * vLits;
    assert( FreeVar < sat_solver_nvars(pSat) );
    pLits[0] = Abc_Var2Lit( PivotVar, 1 ); // F = 1
    pLits[1] = Abc_Var2Lit( FreeVar, 0 );  // iNewLit
    Vec_StrClear( vTempSop );
    Vec_StrGrow( vTempSop, 8 * (Vec_IntSize(vDivVars) + 3) + 1 );
    // check constant 0
    status = sat_solver_solve( pSat, pLits, pLits + 2, 0, 0, 0, 0 );
    if ( status == l_False )
    {
        Vec_StrPush( vTempSop, ' ' );
        Vec_StrPush( vTempSop, '0' );
        Vec_StrPush( vTempSop, '\n' );
        Vec_StrPush( vTempSop, '\0' );
        return Vec_StrReleaseArray(vTempSop);
    }
    // check constant 1
    pLits[0] = Abc_LitNot(pLits[0]);
    status = sat_solver_solve( pSat, pLits, pLits + 2, 0, 0, 0, 0 );
    pLits[0] = Abc_LitNot(pLits[0]);
    if ( status == l_False || Vec_IntSize(vDivVars) == 0 )
    {
        Vec_StrPush( vTempSop, ' ' );
        Vec_StrPush( vTempSop, '1' );
        Vec_StrPush( vTempSop, '\n' );
        Vec_StrPush( vTempSop, '\0' );
        return Vec_StrReleaseArray(vTempSop);
    }
    //Vec_IntPrint( vDivVars );
    vTemp = Vec_IntAlloc( 100 );
    vLits = Vec_IntAlloc( 100 );
    for ( iMint = 0; ; iMint++ )
    {
        if ( iMint == 1000 )
        {
            if ( Vec_IntSize(vDivVars) == 0 )
            {
                printf( "Assuming constant 0 function.\n" );
                Vec_StrClear( vTempSop );
                Vec_StrPush( vTempSop, ' ' );
                Vec_StrPush( vTempSop, '0' );
                Vec_StrPush( vTempSop, '\n' );
                Vec_StrPush( vTempSop, '\0' );
                return Vec_StrReleaseArray(vTempSop);
            }

            printf( "Reached the limit on the number of cubes (1000).\n" );
            Vec_IntFree( vTemp );
            Vec_IntFree( vLits );
            return NULL;
        }
        //int Offset = Vec_StrSize(vTempSop);
        // find onset minterm
        status = sat_solver_solve( pSat, pLits, pLits + 2, 0, 0, 0, 0 );
        if ( status == l_False )
        {
            printf( "Finished enumerating %d cubes.\n", iMint );
            Vec_IntFree( vTemp );
            Vec_IntFree( vLits );
            Vec_StrPush( vTempSop, '\0' );
            return Vec_StrReleaseArray(vTempSop);
        }
        assert( status == l_True );
        // collect divisor literals
        Vec_IntClear( vTempLits );
        Vec_IntPush( vTempLits, Abc_LitNot(pLits[0]) ); // F = 0
        //printf( "%8d %3d  ", 0, 0 );
//        Vec_IntForEachEntry( vDivVars, iVar, i )
        Vec_IntForEachEntryReverse( vDivVars, iVar, i )
        {
            Vec_IntPush( vTempLits, sat_solver_var_literal(pSat, iVar) );
            //printf( "%c", '0' + sat_solver_var_value(pSat, iVar) );
        }
        //printf( "\n" );
        // create new cube
        for ( i = 0; i < Vec_IntSize(vDivVars); i++ )
            Vec_StrPush( vTempSop, '-' );
        if ( fCreatePrime )
        {
            // expand against offset
            status = sat_solver_push(pSat, Vec_IntEntry(vTempLits, 0));
            assert( status == 1 );
            nFinal = sat_solver_minimize_assumptions( pSat, Vec_IntArray(vTempLits)+1, Vec_IntSize(vTempLits)-1, 0 );
            Vec_IntShrink( vTempLits, nFinal+1 );
            sat_solver_pop(pSat);
            // compute cube and add clause
            Vec_IntWriteEntry( vTempLits, 0, Abc_LitNot(pLits[1]) ); // NOT(iNewLit)
            Vec_IntForEachEntryStart( vTempLits, iLit, i, 1 )
            {
                Vec_IntWriteEntry( vTempLits, i, Abc_LitNot(iLit) );
                iVar = Vec_IntFind( vDivVars, Abc_Lit2Var(iLit) );   assert( iVar >= 0 );
                //uCube &= Abc_LitIsCompl(pFinal[i]) ? s_Truths6[iVar] : ~s_Truths6[iVar];
                Vec_StrWriteEntry( vTempSop, Vec_StrSize(vTempSop) - Vec_IntSize(vDivVars) + iVar, (char)('0' + !Abc_LitIsCompl(iLit)) );
            }
        }
        else
        {
            // expand against offset
            status = sat_solver_solve( pSat, Vec_IntArray(vTempLits), Vec_IntLimit(vTempLits), 0, 0, 0, 0 );
            if ( status != l_False )
                printf( "Selected onset minterm number %d belongs to the offset (this is a bug).\n", iMint );
            assert( status == l_False );

            // compute cube and add clause
            nFinal = sat_solver_final( pSat, &pFinal );
            Vec_IntSelectSort( pFinal, nFinal );
/*
            // pretend that this is final
            veci_resize(&pSat->conf_final,0);
            Vec_IntForEachEntry( vTempLits, iLit, i )
                veci_push(&pSat->conf_final, lit_neg(iLit));
            pFinal = pSat->conf_final.ptr;
            nFinal = Vec_IntSize(vTempLits);
*/
            ////////////////////////////////////////////////////////
            // create new cube
            Vec_IntClear( vTemp );
            Vec_IntPush( vTemp, Abc_LitNot(pLits[0]) ); // F = 0
            for ( i = 0; i < nFinal; i++ )
            {
                if ( pFinal[i] == pLits[0] )
                    continue;
                Vec_IntPush( vTemp, Abc_LitNot(pFinal[i]) );
            }

            //Vec_IntPrint( vTemp );
            // try removing each one starting with the last one
            //printf( "Started with %d lits   ", nFinal-1 );
            for ( i = nFinal - 1; i > 0; i-- )
            {
                int iLit = Vec_IntEntry( vTemp, i );
                Vec_IntDrop( vTemp, i );
                // try SAT
                status = sat_solver_solve( pSat, Vec_IntArray(vTemp), Vec_IntLimit(vTemp), 0, 0, 0, 0 );
                if ( status == l_False )
                {
                //    printf( "U" );
                    continue;
                }
                //if ( status == l_True )
                //    printf( "S" );
                //else if ( status == l_Undef )
                //    printf( "T" );
                Vec_IntInsert( vTemp, i, iLit );
            }
            //printf( "   Ended up with %d lits\n", Vec_IntSize(vTemp)-1 );
            //Vec_IntPrint( vTemp );

            Vec_IntForEachEntry( vTemp, iLit, i )
                pFinal[i] = Abc_LitNot(iLit);
            nFinal = Vec_IntSize(vTemp);
            ////////////////////////////////////////////////////////


            Vec_IntClear( vTempLits );
            Vec_IntPush( vTempLits, Abc_LitNot(pLits[1]) ); // NOT(iNewLit)
            for ( i = 0; i < nFinal; i++ )
            {
                if ( pFinal[i] == pLits[0] )
                    continue;
                Vec_IntPush( vTempLits, pFinal[i] );
                iVar = Vec_IntFind( vDivVars, Abc_Lit2Var(pFinal[i]) );   assert( iVar >= 0 );
                //uCube &= Abc_LitIsCompl(pFinal[i]) ? s_Truths6[iVar] : ~s_Truths6[iVar];
                Vec_StrWriteEntry( vTempSop, Vec_StrSize(vTempSop) - Vec_IntSize(vDivVars) + iVar, (char)('0' + Abc_LitIsCompl(pFinal[i])) );
            }
        }
        //printf( "%6d : %8d %3d  ", iMint, (int)pSat->stats.conflicts, Vec_IntSize(vTempLits)-1 );

        Vec_StrAppend( vTempSop, " 1\n" );
        status = sat_solver_addclause( pSat, Vec_IntArray(vTempLits), Vec_IntLimit(vTempLits) );
        assert( status );

        //Vec_StrPush( vTempSop, '\0' );
        //printf( "%s", Vec_StrEntryP(vTempSop, Offset) );
        //Vec_StrPop( vTempSop );
    }
    assert( 0 ); 
    return NULL;
}